

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

int select_reg(reg_state *state,int vreg,int loc,int src)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  reg_state *in_RDI;
  int typ_2;
  int offset_2;
  int typ_1;
  int offset_1;
  int typ;
  int offset;
  int i;
  int used_vreg;
  int tentative_assign;
  bitv tmp_assigns [6];
  int preg;
  preg_info *ipregs;
  preg_info *fpregs;
  preg_info *pregs;
  basic_block_conflict bb;
  dill_stream c;
  vreg_info *vregs;
  int old_vreg;
  int ret_reg;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  bit_vec in_stack_ffffffffffffff50;
  dill_stream_conflict vec;
  undefined8 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint local_90;
  int local_88;
  int local_84;
  uint local_7c;
  undefined1 local_78 [28];
  uint local_5c;
  preg_info *local_58;
  preg_info *local_50;
  preg_info *local_48;
  basic_block_conflict local_40;
  dill_stream_conflict local_38;
  vreg_info *local_30;
  uint local_24;
  uint local_20;
  int local_1c;
  int local_18;
  uint local_14;
  reg_state *local_10;
  uint local_4;
  
  local_20 = 0xffffffff;
  local_24 = 0xffffffff;
  local_30 = in_RDI->c->p->vregs;
  local_38 = in_RDI->c;
  local_40 = in_RDI->bb;
  local_50 = in_RDI->fpregs;
  local_58 = in_RDI->ipregs;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  iVar1 = dill_type_of(local_38,in_ESI);
  if (iVar1 == 9 || iVar1 == 10) {
    local_48 = local_10->fpregs;
  }
  else {
    local_48 = local_10->ipregs;
  }
  if (select_reg::reg_debug == -1) {
    pcVar3 = getenv("REG_DEBUG");
    select_reg::reg_debug = (int)(pcVar3 != (char *)0x0);
  }
  if (((int)local_14 < 100) && (local_38->p->c_param_args[(int)local_14].is_register != '\0')) {
    local_4 = local_38->p->c_param_args[(int)local_14].in_reg;
  }
  else if (local_14 == 100) {
    local_4 = local_38->dill_local_pointer;
  }
  else {
    iVar1 = dill_type_of(local_38,local_14);
    if (iVar1 == 0xc) {
      local_4 = 0xffffffff;
    }
    else {
      iVar1 = get_in_reg(local_10,local_14);
      if (iVar1 == -1) {
        local_7c = 0xffffffff;
        init_bit_vec(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        if (select_reg::reg_debug != 0) {
          printf("Get assignment for vreg %d\n",(ulong)local_14);
        }
        while (local_5c = get_tentative_assign
                                    ((dill_stream)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                     in_stack_ffffffffffffff50), local_5c != 0xffffffff) {
          if (select_reg::reg_debug != 0) {
            printf("checking preg %d\n",(ulong)local_5c);
          }
          if (local_10->reg_count <= (int)local_5c) {
            local_50 = (preg_info *)
                       dill_realloc(in_stack_ffffffffffffff50,
                                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            local_58 = (preg_info *)
                       dill_realloc(in_stack_ffffffffffffff50,
                                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            local_10->fpregs = local_50;
            local_10->ipregs = local_58;
            for (local_84 = local_10->reg_count; local_84 <= (int)local_5c; local_84 = local_84 + 1)
            {
              local_50[local_84].holds = -1;
              local_58[local_84].holds = -1;
            }
            iVar1 = dill_type_of(local_38,local_14);
            if (iVar1 == 9 || iVar1 == 10) {
              local_48 = local_10->fpregs;
            }
            else {
              local_48 = local_10->ipregs;
            }
            local_10->reg_count = local_5c + 1;
          }
          uVar2 = local_48[(int)local_5c].holds;
          if (uVar2 == 0xffffffff) {
            local_20 = local_5c;
            if (select_reg::reg_debug != 0) {
              printf("preg %d empty, assigning to vreg %d\n",(ulong)local_5c,(ulong)local_14);
            }
            break;
          }
          iVar1 = get_assign_loc(local_10,uVar2);
          if ((iVar1 == local_18) && (local_1c != 0)) {
            if (select_reg::reg_debug != 0) {
              printf("preg %d assigned to vreg %d at this loc\n",(ulong)local_5c,(ulong)uVar2);
            }
          }
          else {
            iVar1 = get_last_use(local_10,uVar2);
            if ((iVar1 < local_18) ||
               ((local_1c == 0 && (iVar1 = get_last_use(local_10,uVar2), iVar1 == local_18)))) {
              local_20 = local_5c;
              if (select_reg::reg_debug != 0) {
                printf("preg %d assigned to vreg %d, but that vreg is done, assigning\n",
                       (ulong)local_5c,(ulong)uVar2);
              }
              break;
            }
            if (local_7c == 0xffffffff) {
              local_7c = local_5c;
              if (select_reg::reg_debug != 0) {
                printf("preg %d is new tentative assign\n",(ulong)local_5c);
              }
            }
            else {
              in_stack_ffffffffffffff60 = get_use_metric(local_10,local_48[(int)local_7c].holds);
              iVar1 = get_use_metric(local_10,uVar2);
              if (iVar1 < in_stack_ffffffffffffff60) {
                if (select_reg::reg_debug != 0) {
                  printf("preg %d is better tentative assign\n",(ulong)local_5c);
                }
                local_7c = local_5c;
              }
              else if (select_reg::reg_debug != 0) {
                printf("previous assign %d was better tentative assign\n",(ulong)local_7c);
              }
            }
          }
        }
        if (local_20 == 0xffffffff) {
          local_20 = local_7c;
        }
        iVar1 = (int)((ulong)local_78 >> 0x20);
        vec = local_38;
        dill_type_of(local_38,local_14);
        put_tentative_assigns
                  ((dill_stream)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar1,
                   (bit_vec)vec,in_stack_ffffffffffffff4c);
        if (local_20 != 0xffffffff) {
          local_24 = local_48[(int)local_20].holds;
        }
        if (local_24 != 0xffffffff) {
          iVar1 = get_last_use(local_10,local_24);
          if (((local_18 < iVar1) ||
              (iVar1 = live_at_end((basic_block_conflict)
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0),
              iVar1 != 0)) && (iVar1 = update_in_reg(local_10,local_24), iVar1 != 0)) {
            local_88 = offset_of(local_38,local_24);
            iVar1 = dill_type_of(local_38,local_24);
            set_value_in_mem(local_10,local_24,1);
            set_update_in_reg(local_10,local_24,0);
            if (local_88 == -0x21524111) {
              local_88 = (*local_38->j->local)(local_38,0,iVar1);
              local_30[(int)(local_24 - 100)].offset = local_88;
            }
            if (select_reg::reg_debug != 0) {
              printf("Spilling vreg %d to memory, new assignment is %d\n",(ulong)local_24,
                     (ulong)local_14);
            }
            if ((int)local_24 < 100) {
              (*local_38->j->storei)
                        (local_38,iVar1,0,local_20,local_38->dill_param_reg_pointer,(long)local_88);
            }
            else {
              (*local_38->j->storei)
                        (local_38,iVar1,0,local_20,local_38->dill_local_pointer,(long)local_88);
            }
          }
          set_in_reg(local_10,local_24,-1);
        }
        if ((local_1c == 0) || (iVar1 = value_in_mem(local_10,local_14), iVar1 == 0)) {
          set_update_in_reg(local_10,local_14,1);
        }
        else {
          local_90 = offset_of(local_38,local_14);
          iVar1 = dill_type_of(local_38,local_14);
          if (local_90 == 0xdeadbeef) {
            printf("Virtual register %d used as source but not previously assigned \n",
                   (ulong)local_14);
            local_90 = 0;
          }
          if (select_reg::reg_debug != 0) {
            printf("Loading vreg %d from offset %d into preg %d\n",(ulong)local_14,(ulong)local_90,
                   (ulong)local_20);
          }
          if ((int)local_14 < 100) {
            (*local_38->j->loadi)
                      (local_38,iVar1,0,local_20,local_38->dill_param_reg_pointer,
                       (long)(int)local_90);
          }
          else {
            (*local_38->j->loadi)
                      (local_38,iVar1,0,local_20,local_38->dill_local_pointer,(long)(int)local_90);
          }
        }
        if (local_20 != 0xffffffff) {
          local_48[(int)local_20].holds = local_14;
        }
        set_in_reg(local_10,local_14,local_20);
        set_assign_loc(local_10,local_14,local_18);
        if (((local_1c != 0) && (local_20 == 0xffffffff)) &&
           (iVar1 = value_in_mem(local_10,local_14), iVar1 == 0)) {
          uVar2 = offset_of(local_38,local_14);
          iVar1 = dill_type_of(local_38,local_14);
          if (select_reg::reg_debug != 0) {
            printf("Special x86 loading vreg %d from offset %d into preg %d\n",(ulong)local_14,
                   (ulong)uVar2,(ulong)local_20);
          }
          if ((int)local_14 < 100) {
            (*local_38->j->loadi)
                      (local_38,iVar1,0,local_20,local_38->dill_param_reg_pointer,(long)(int)uVar2);
          }
          else {
            (*local_38->j->loadi)
                      (local_38,iVar1,0,local_20,local_38->dill_local_pointer,(long)(int)uVar2);
          }
        }
        local_4 = local_20;
      }
      else {
        local_20 = get_in_reg(local_10,local_14);
        set_assign_loc(local_10,local_14,local_18);
        if (local_1c == 0) {
          set_update_in_reg(local_10,local_14,1);
        }
        local_4 = local_20;
      }
    }
  }
  return local_4;
}

Assistant:

static int
select_reg(reg_state* state, int vreg, int loc, int src)
{
    static int reg_debug = -1;
    int ret_reg = -1;
    int old_vreg = -1;
    vreg_info* vregs = state->c->p->vregs;
    dill_stream c = state->c;
    basic_block bb = state->bb;
    preg_info* pregs;
    preg_info* fpregs = state->fpregs;
    preg_info* ipregs = state->ipregs;
    switch (dill_type_of(c, vreg)) {
    case DILL_F:
    case DILL_D:
        pregs = state->fpregs;
        break;
    default:
        pregs = state->ipregs;
        break;
    }
    if (reg_debug == -1) {
        reg_debug = (getenv("REG_DEBUG") != NULL);
    }
    if (vreg < 100) {
        /* parameter */
        if (c->p->c_param_args[vreg].is_register) {
            return c->p->c_param_args[vreg].in_reg;
        }
    }
    if (vreg == 100) {
        return dill_lp(c);
    }
    if (dill_type_of(c, vreg) == DILL_B) {
        /* not really using this */
        return -1;
    }
    if (get_in_reg(state, vreg) != -1) {
        ret_reg = get_in_reg(state, vreg);
        set_assign_loc(state, vreg, loc);
        if (!src)
            set_update_in_reg(state, vreg, 1);
        return ret_reg;
    } else {
        int preg;
        struct bitv tmp_assigns[6];
        int tentative_assign = -1;
        init_bit_vec(&tmp_assigns[0], sizeof(tmp_assigns));
        if (reg_debug)
            printf("Get assignment for vreg %d\n", vreg);
        while ((preg = get_tentative_assign(c, vreg, &tmp_assigns[0])) != -1) {
            int used_vreg;
            if (reg_debug)
                printf("checking preg %d\n", preg);
            if (preg >= state->reg_count) {
                int i;
                fpregs = realloc(fpregs, sizeof(reg_state) * (preg + 1));
                ipregs = realloc(ipregs, sizeof(reg_state) * (preg + 1));
                state->fpregs = fpregs;
                state->ipregs = ipregs;
                for (i = state->reg_count; i <= preg; i++) {
                    ipregs[i].holds = fpregs[i].holds = -1;
                }
                switch (dill_type_of(c, vreg)) {
                case DILL_F:
                case DILL_D:
                    pregs = state->fpregs;
                    break;
                default:
                    pregs = state->ipregs;
                    break;
                }
                state->reg_count = preg + 1;
            }
            used_vreg = pregs[preg].holds;
            if (used_vreg == -1) {
                ret_reg = preg;
                if (reg_debug)
                    printf("preg %d empty, assigning to vreg %d\n", preg, vreg);
                break;
            }
            if ((get_assign_loc(state, used_vreg) == loc) && src) {
                if (reg_debug)
                    printf("preg %d assigned to vreg %d at this loc\n", preg,
                           used_vreg);
                continue;
            }
            if ((get_last_use(state, used_vreg) < loc) ||
                (!src && (get_last_use(state, used_vreg) == loc))) {
                ret_reg = preg;
                if (reg_debug)
                    printf(
                        "preg %d assigned to vreg %d, but that vreg is done, "
                        "assigning\n",
                        preg, used_vreg);
                break;
            }
            if (tentative_assign == -1) {
                tentative_assign = preg;
                if (reg_debug)
                    printf("preg %d is new tentative assign\n", preg);
            } else if (get_use_metric(state, pregs[tentative_assign].holds) >
                       get_use_metric(state, used_vreg)) {
                if (reg_debug)
                    printf("preg %d is better tentative assign\n", preg);
                tentative_assign = preg;
            } else {
                if (reg_debug)
                    printf("previous assign %d was better tentative assign\n",
                           tentative_assign);
            }
        }
        if (ret_reg == -1)
            ret_reg = tentative_assign;
        put_tentative_assigns(c, -1, &tmp_assigns[0], dill_type_of(c, vreg));
    }
    if (ret_reg != -1)
        old_vreg = pregs[ret_reg].holds;
    if (old_vreg != -1) {
        /* if this is not the same as the old assignment */
        if (((get_last_use(state, old_vreg) > loc) ||
             live_at_end(bb, old_vreg)) &&
            update_in_reg(state, old_vreg)) {
            int offset = offset_of(c, old_vreg);
            int typ = dill_type_of(c, old_vreg);
            set_value_in_mem(state, old_vreg, 1);
            set_update_in_reg(state, old_vreg, 0);
            if (offset == 0xdeadbeef) {
                /* not previously spilled */
                offset = vregs[old_vreg - 100].offset = dill_local(c, typ);
            }
            /* spill vreg to memory */
            if (reg_debug)
                printf("Spilling vreg %d to memory, new assignment is %d\n",
                       old_vreg, vreg);
            if (old_vreg >= 100) {
                c->j->storei(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
            } else {
                c->j->storei(c, typ, 0, ret_reg, c->dill_param_reg_pointer,
                             offset);
            }
        }
        set_in_reg(state, old_vreg, -1);
    }
    if (src && value_in_mem(state, vreg)) {
        int offset = offset_of(c, vreg);
        int typ = dill_type_of(c, vreg);
        if (offset == 0xdeadbeef) {
            /* not previously assigned */
            printf(
                "Virtual register %d used as source but not previously "
                "assigned \n",
                vreg);
            offset = 0;
        }
        if (reg_debug)
            printf("Loading vreg %d from offset %d into preg %d\n", vreg,
                   offset, ret_reg);
        if (vreg >= 100) {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
        } else {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_param_reg_pointer, offset);
        }
    } else {
        set_update_in_reg(state, vreg, 1);
    }
    if (ret_reg != -1)
        pregs[ret_reg].holds = vreg;
    set_in_reg(state, vreg, ret_reg);
    set_assign_loc(state, vreg, loc);
    if (src && (ret_reg == -1) && !value_in_mem(state, vreg)) {
        /* special x86 no float regs case */
        int offset = offset_of(c, vreg);
        int typ = dill_type_of(c, vreg);
        if (reg_debug)
            printf("Special x86 loading vreg %d from offset %d into preg %d\n",
                   vreg, offset, ret_reg);
        if (vreg >= 100) {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
        } else {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_param_reg_pointer, offset);
        }
    }
    return ret_reg;
}